

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O2

void __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::~thread_pool(thread_pool<(unsigned_char)__x00_> *this)

{
  void *in_RSI;
  
  wait(this,in_RSI);
  std::unique_ptr<std::jthread[],_std::default_delete<std::jthread[]>_>::~unique_ptr(&this->threads)
  ;
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tasks).c);
  std::condition_variable::~condition_variable(&this->tasks_done_cv);
  std::_V2::condition_variable_any::~condition_variable_any(&this->task_available_cv);
  std::_Function_base::~_Function_base(&(this->init_func).super__Function_base);
  std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

~thread_pool() noexcept
    {
#ifdef __cpp_exceptions
        try
        {
#endif
            wait();
#ifndef __cpp_lib_jthread
            destroy_threads();
#endif
#ifdef __cpp_exceptions
        }
        catch (...)
        {
        }
#endif
    }